

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_shift_r(mbedtls_mpi *X,size_t count)

{
  mbedtls_mpi_uint mVar1;
  ulong uVar2;
  ulong uVar3;
  mbedtls_mpi_uint r1;
  mbedtls_mpi_uint r0;
  size_t v1;
  size_t v0;
  size_t i;
  size_t count_local;
  mbedtls_mpi *X_local;
  
  r1 = 0;
  uVar2 = count >> 6;
  uVar3 = count & 0x3f;
  if ((X->n < uVar2) || ((uVar2 == X->n && (uVar3 != 0)))) {
    X_local._4_4_ = mbedtls_mpi_lset(X,0);
  }
  else {
    if (uVar2 != 0) {
      for (v0 = 0; v0 < X->n - uVar2; v0 = v0 + 1) {
        X->p[v0] = X->p[v0 + uVar2];
      }
      for (; v0 < X->n; v0 = v0 + 1) {
        X->p[v0] = 0;
      }
    }
    if (uVar3 != 0) {
      for (v0 = X->n; v0 != 0; v0 = v0 - 1) {
        mVar1 = X->p[v0 - 1];
        X->p[v0 - 1] = X->p[v0 - 1] >> (sbyte)uVar3;
        X->p[v0 - 1] = r1 | X->p[v0 - 1];
        r1 = mVar1 << (0x40U - (sbyte)uVar3 & 0x3f);
      }
    }
    X_local._4_4_ = 0;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_shift_r( mbedtls_mpi *X, size_t count )
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if( v0 > X->n || ( v0 == X->n && v1 > 0 ) )
        return mbedtls_mpi_lset( X, 0 );

    /*
     * shift by count / limb_size
     */
    if( v0 > 0 )
    {
        for( i = 0; i < X->n - v0; i++ )
            X->p[i] = X->p[i + v0];

        for( ; i < X->n; i++ )
            X->p[i] = 0;
    }

    /*
     * shift by count % limb_size
     */
    if( v1 > 0 )
    {
        for( i = X->n; i > 0; i-- )
        {
            r1 = X->p[i - 1] << (biL - v1);
            X->p[i - 1] >>= v1;
            X->p[i - 1] |= r0;
            r0 = r1;
        }
    }

    return( 0 );
}